

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_16x32_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  int iVar5;
  int8_t *piVar6;
  int iVar7;
  int32_t *piVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  __m128i round;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i in [128];
  undefined8 local_838;
  int aiStack_830 [254];
  longlong local_438 [129];
  undefined1 auVar14 [16];
  
  piVar6 = av1_fwd_txfm_shift_ls[9];
  uVar9 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar3 = *(code **)((long)col_highbd_txfm8x32_arr + uVar9);
  pcVar4 = *(code **)((long)row_highbd_txfm8x32_arr + uVar9);
  lVar13 = 0;
  load_buffer_16x16(input,(__m128i *)&local_838,stride,0,0,(int)*av1_fwd_txfm_shift_ls[9]);
  load_buffer_16x16(input + (stride << 4),(__m128i *)local_438,stride,0,0,(int)*piVar6);
  do {
    (*pcVar3)((long)&local_838 + lVar13,(long)&local_838 + lVar13,0xc,4);
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x40);
  col_txfm_16x16_rounding((__m128i *)&local_838,-(int)piVar6[1]);
  col_txfm_16x16_rounding((__m128i *)local_438,-(int)piVar6[1]);
  piVar8 = coeff + 0x60;
  piVar10 = aiStack_830 + 0x2e;
  lVar13 = 0;
  do {
    lVar11 = -0x80;
    piVar12 = piVar10;
    do {
      auVar16 = *(undefined1 (*) [16])(piVar12 + -0x30);
      iVar5 = piVar12[-0xf];
      iVar7 = piVar12[1];
      auVar20._0_8_ = auVar16._0_8_;
      auVar20._8_4_ = auVar16._4_4_;
      auVar20._12_4_ = piVar12[-0x1f];
      auVar18._4_4_ = piVar12[-0x20];
      auVar18._0_4_ = auVar16._0_4_;
      auVar15._0_8_ = CONCAT44(piVar12[-0x1e],auVar16._8_4_);
      auVar15._8_4_ = auVar16._12_4_;
      auVar15._12_4_ = piVar12[-0x1d];
      auVar18._12_4_ = *piVar12;
      auVar18._8_4_ = piVar12[-0x10];
      auVar16._0_8_ = CONCAT44(piVar12[2],piVar12[-0xe]);
      auVar16._8_4_ = piVar12[-0xd];
      auVar16._12_4_ = piVar12[3];
      *(undefined1 (*) [16])((long)piVar8 + lVar11 + -0x100) = auVar18;
      puVar1 = (undefined8 *)((long)piVar8 + lVar11 + -0x80);
      *puVar1 = auVar20._8_8_;
      *(int *)(puVar1 + 2) = iVar5;
      *(int *)((long)puVar1 + 0x14) = iVar7;
      *(undefined8 *)((long)piVar8 + lVar11) = auVar15._0_8_;
      ((undefined8 *)((long)piVar8 + lVar11))[1] = auVar16._0_8_;
      puVar1 = (undefined8 *)((long)piVar8 + lVar11 + 0x80);
      *puVar1 = auVar15._8_8_;
      puVar1[1] = auVar16._8_8_;
      piVar12 = piVar12 + 0x40;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0);
    lVar13 = lVar13 + 1;
    piVar8 = piVar8 + 0x80;
    piVar10 = piVar10 + 4;
  } while (lVar13 != 4);
  (*pcVar4)(coeff,&local_838,0xd,8);
  auVar14._8_8_ = extraout_XMM1_Qb;
  auVar14._0_8_ = extraout_XMM1_Qa;
  bVar2 = piVar6[2];
  if ((char)bVar2 < '\0') {
    iVar7 = 1 << (~bVar2 & 0x1f);
    lVar13 = 0;
    auVar15 = ZEXT416((uint)-(int)(char)bVar2);
    auVar16 = pmovsxwd(auVar16,0x16a116a116a116a1);
    auVar18 = pmovsxwd(auVar18,0x800080008000800);
    do {
      auVar19._0_4_ = *(int *)((long)&local_838 + lVar13) + iVar7 >> auVar15;
      auVar19._4_4_ = *(int *)((long)aiStack_830 + lVar13 + -4) + iVar7 >> auVar15;
      auVar19._8_4_ = *(int *)((long)aiStack_830 + lVar13) + iVar7 >> auVar15;
      auVar19._12_4_ = *(int *)((long)aiStack_830 + lVar13 + 4) + iVar7 >> auVar15;
      auVar20 = pmulld(auVar19,auVar16);
      piVar10 = (int *)((long)coeff + lVar13);
      *piVar10 = auVar20._0_4_ + auVar18._0_4_ >> 0xc;
      piVar10[1] = auVar20._4_4_ + auVar18._4_4_ >> 0xc;
      piVar10[2] = auVar20._8_4_ + auVar18._8_4_ >> 0xc;
      piVar10[3] = auVar20._12_4_ + auVar18._12_4_ >> 0xc;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x800);
  }
  else {
    lVar13 = 0;
    auVar15 = pmovsxwd(auVar14,0x16a116a116a116a1);
    auVar16 = pmovsxwd(auVar16,0x800080008000800);
    do {
      auVar17._0_4_ = *(int *)((long)&local_838 + lVar13) << (int)(char)bVar2;
      auVar17._4_4_ = *(undefined4 *)((long)aiStack_830 + lVar13 + -4);
      auVar17._8_4_ = *(undefined4 *)((long)aiStack_830 + lVar13);
      auVar17._12_4_ = *(undefined4 *)((long)aiStack_830 + lVar13 + 4);
      auVar18 = pmulld(auVar17,auVar15);
      piVar10 = (int *)((long)coeff + lVar13);
      *piVar10 = auVar18._0_4_ + auVar16._0_4_ >> 0xc;
      piVar10[1] = auVar18._4_4_ + auVar16._4_4_ >> 0xc;
      piVar10[2] = auVar18._8_4_ + auVar16._8_4_ >> 0xc;
      piVar10[3] = auVar18._12_4_ + auVar16._12_4_ >> 0xc;
      lVar13 = lVar13 + 0x10;
    } while (lVar13 != 0x800);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_16x32_sse4_1(const int16_t *input, int32_t *coeff,
                                 int stride, TX_TYPE tx_type, int bd) {
  __m128i in[128];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x32_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  // column transform
  load_buffer_16x16(input, in, stride, 0, 0, shift[0]);
  load_buffer_16x16(input + 16 * stride, in + 64, stride, 0, 0, shift[0]);

  for (int i = 0; i < 4; i++) {
    col_txfm((in + i), (in + i), bitcol, 4);
  }
  col_txfm_16x16_rounding(&in[0], -shift[1]);
  col_txfm_16x16_rounding(&in[64], -shift[1]);
  transpose_8nx8n(in, outcoef128, 16, 32);

  // row transform
  row_txfm(outcoef128, in, bitrow, 8);
  av1_round_shift_rect_array_32_sse4_1(in, outcoef128, 128, -shift[2],
                                       NewSqrt2);
  (void)bd;
}